

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_LZWDecoder.hh
# Opt level: O2

void __thiscall Pl_LZWDecoder::~Pl_LZWDecoder(Pl_LZWDecoder *this)

{
  std::vector<Buffer,_std::allocator<Buffer>_>::~vector(&this->table);
  Pipeline::~Pipeline(&this->super_Pipeline);
  return;
}

Assistant:

~Pl_LZWDecoder() final = default;